

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O1

void sha1_pad(sha1_ctxt *ctxt)

{
  byte bVar1;
  uint uVar2;
  size_t __n;
  ulong uVar3;
  
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = 0x80;
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  uVar2 = ctxt->count & 0x3f;
  uVar3 = (ulong)uVar2;
  __n = 0x40 - uVar3;
  if (0x38 < (byte)uVar2) {
    memset((void *)((long)&ctxt->m + uVar3),0,__n);
    ctxt->count = (char)__n + ctxt->count & 0x3f;
    sha1_step(ctxt);
    uVar3 = (ulong)(ctxt->count & 0x3f);
    __n = 0x40 - uVar3;
  }
  memset((void *)((long)&ctxt->m + uVar3),0,__n - 8);
  bVar1 = (char)(__n - 8) + ctxt->count;
  uVar2 = bVar1 & 0x3f;
  ctxt->count = (uchar)uVar2;
  (ctxt->m).b8[uVar2] = (ctxt->c).b8[7];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[6];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[5];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[4];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[3];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[2];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[1];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 == 0) {
    sha1_step(ctxt);
  }
  bVar1 = ctxt->count;
  (ctxt->m).b8[bVar1 & 0x3f] = (ctxt->c).b8[0];
  bVar1 = bVar1 + 1 & 0x3f;
  ctxt->count = bVar1;
  if (bVar1 != 0) {
    return;
  }
  sha1_step(ctxt);
  return;
}

Assistant:

void
sha1_pad(struct sha1_ctxt *ctxt)
{
	size_t padlen;		/*pad length in bytes*/
	size_t padstart;

	PUTPAD(0x80);

	padstart = COUNT % 64;
	padlen = 64 - padstart;
	if (padlen < 8) {
		memset(&ctxt->m.b8[padstart], 0, padlen);
		COUNT = (unsigned char)(COUNT + padlen);
		COUNT %= 64;
		sha1_step(ctxt);
		padstart = COUNT % 64;	/* should be 0 */
		padlen = 64 - padstart;	/* should be 64 */
	}
	memset(&ctxt->m.b8[padstart], 0, padlen - 8);
	COUNT = (unsigned char)(COUNT + (padlen - 8));
	COUNT %= 64;
#if BYTE_ORDER == BIG_ENDIAN
	PUTPAD(ctxt->c.b8[0]); PUTPAD(ctxt->c.b8[1]);
	PUTPAD(ctxt->c.b8[2]); PUTPAD(ctxt->c.b8[3]);
	PUTPAD(ctxt->c.b8[4]); PUTPAD(ctxt->c.b8[5]);
	PUTPAD(ctxt->c.b8[6]); PUTPAD(ctxt->c.b8[7]);
#else
	PUTPAD(ctxt->c.b8[7]); PUTPAD(ctxt->c.b8[6]);
	PUTPAD(ctxt->c.b8[5]); PUTPAD(ctxt->c.b8[4]);
	PUTPAD(ctxt->c.b8[3]); PUTPAD(ctxt->c.b8[2]);
	PUTPAD(ctxt->c.b8[1]); PUTPAD(ctxt->c.b8[0]);
#endif
}